

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O0

int nghttp2_bufs_init3(nghttp2_bufs *bufs,size_t chunk_length,size_t max_chunk,size_t chunk_keep,
                      size_t offset,nghttp2_mem *mem)

{
  nghttp2_buf_chain *local_50;
  nghttp2_buf_chain *chain;
  nghttp2_mem *pnStack_40;
  int rv;
  nghttp2_mem *mem_local;
  size_t offset_local;
  size_t chunk_keep_local;
  size_t max_chunk_local;
  size_t chunk_length_local;
  nghttp2_bufs *bufs_local;
  
  if (((chunk_keep == 0) || (max_chunk < chunk_keep)) || (chunk_length < offset)) {
    bufs_local._4_4_ = -0x1f5;
  }
  else {
    pnStack_40 = mem;
    mem_local = (nghttp2_mem *)offset;
    offset_local = chunk_keep;
    chunk_keep_local = max_chunk;
    max_chunk_local = chunk_length;
    chunk_length_local = (size_t)bufs;
    bufs_local._4_4_ = buf_chain_new(&local_50,chunk_length,mem);
    if (bufs_local._4_4_ == 0) {
      *(nghttp2_mem **)(chunk_length_local + 0x10) = pnStack_40;
      *(nghttp2_mem **)(chunk_length_local + 0x38) = mem_local;
      *(nghttp2_buf_chain **)chunk_length_local = local_50;
      *(undefined8 *)(chunk_length_local + 8) = *(undefined8 *)chunk_length_local;
      *(long *)(*(long *)(chunk_length_local + 8) + 0x18) =
           (long)&mem_local->mem_user_data + *(long *)(*(long *)(chunk_length_local + 8) + 0x18);
      *(long *)(*(long *)(chunk_length_local + 8) + 0x20) =
           (long)&mem_local->mem_user_data + *(long *)(*(long *)(chunk_length_local + 8) + 0x20);
      *(size_t *)(chunk_length_local + 0x18) = max_chunk_local;
      *(undefined8 *)(chunk_length_local + 0x28) = 1;
      *(size_t *)(chunk_length_local + 0x20) = chunk_keep_local;
      *(size_t *)(chunk_length_local + 0x30) = offset_local;
      bufs_local._4_4_ = 0;
    }
  }
  return bufs_local._4_4_;
}

Assistant:

int nghttp2_bufs_init3(nghttp2_bufs *bufs, size_t chunk_length,
                       size_t max_chunk, size_t chunk_keep, size_t offset,
                       nghttp2_mem *mem) {
  int rv;
  nghttp2_buf_chain *chain;

  if (chunk_keep == 0 || max_chunk < chunk_keep || chunk_length < offset) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  rv = buf_chain_new(&chain, chunk_length, mem);
  if (rv != 0) {
    return rv;
  }

  bufs->mem = mem;
  bufs->offset = offset;

  bufs->head = chain;
  bufs->cur = bufs->head;

  nghttp2_buf_shift_right(&bufs->cur->buf, offset);

  bufs->chunk_length = chunk_length;
  bufs->chunk_used = 1;
  bufs->max_chunk = max_chunk;
  bufs->chunk_keep = chunk_keep;

  return 0;
}